

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetFilesPathsRecursively.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetFilePathsRecursively
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  string nonTrailingSlashPath;
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (path->_M_string_length != 0) {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
    if ((path->_M_dataplus)._M_p[path->_M_string_length - 1] == '/') {
      std::__cxx11::string::substr((ulong)local_40,(ulong)path);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80,local_78 + (long)local_80);
    _getFilePathsRecursively(&local_60,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetFilePathsRecursively(const std::string path) {
    std::vector<std::string> result;

    if (path.empty()){
        return result;
    }

    std::string nonTrailingSlashPath = path;
    if (path[path.size()-1] == '/') {
        nonTrailingSlashPath = path.substr(0, path.size() - 1);
    }

    _getFilePathsRecursively(nonTrailingSlashPath, result);

    return result;
}